

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_arena_c__:48:3)>
* __thiscall
kj::defer<kj::Arena::~Arena()::__0>
          (Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_arena_c__:48:3)>
           *__return_storage_ptr__,kj *this,Type *func)

{
  Type *func_00;
  Type *func_local;
  
  func_00 = fwd<kj::Arena::~Arena()::__0>
                      ((NoInfer<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_arena_c__:48:3)>
                        *)this);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena.c++:48:3)>
  ::Deferred(__return_storage_ptr__,func_00);
  return __return_storage_ptr__;
}

Assistant:

_::Deferred<Func> defer(Func&& func) {
  // Returns an object which will invoke the given functor in its destructor.  The object is not
  // copyable but is movable with the semantics you'd expect.  Since the return type is private,
  // you need to assign to an `auto` variable.
  //
  // The KJ_DEFER macro provides slightly more convenient syntax for the common case where you
  // want some code to run at current scope exit.

  return _::Deferred<Func>(kj::fwd<Func>(func));
}